

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O1

_Bool unix_add_keyfile(char *filename_str,_Bool add_encrypted)

{
  bool bVar1;
  int iVar2;
  Filename *filename;
  char *prompt;
  char *passphrase;
  size_t n;
  undefined4 uVar3;
  char *err;
  char *local_48;
  undefined4 local_3c;
  char *local_38;
  
  filename = filename_from_str(filename_str);
  iVar2 = pageant_add_keyfile(filename,(char *)0x0,&local_48,add_encrypted);
  uVar3 = 1;
  if (iVar2 != 0) {
    if (iVar2 == 1) {
      fprintf(_stderr,"pageant: %s: %s\n",filename_str,local_48);
      uVar3 = 0;
    }
    else {
      local_3c = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar2 >> 8),1);
      local_38 = filename_str;
      do {
        bVar1 = false;
        prompt = dupprintf("Enter passphrase to load key \'%s\'",local_48);
        passphrase = askpass(prompt);
        safefree(local_48);
        safefree(prompt);
        local_48 = (char *)0x0;
        if (passphrase != (char *)0x0) {
          iVar2 = pageant_add_keyfile(filename,passphrase,&local_48,add_encrypted);
          n = strlen(passphrase);
          smemclr(passphrase,n);
          safefree(passphrase);
          if (iVar2 != 0) {
            if (iVar2 != 1) {
              bVar1 = true;
              goto LAB_0010b4f7;
            }
            local_3c = 0;
            fprintf(_stderr,"pageant: %s: %s\n",local_38,local_48);
          }
          bVar1 = false;
        }
LAB_0010b4f7:
        uVar3 = local_3c;
      } while (bVar1);
    }
  }
  safefree(local_48);
  filename_free(filename);
  return (_Bool)((byte)uVar3 & 1);
}

Assistant:

static bool unix_add_keyfile(const char *filename_str, bool add_encrypted)
{
    Filename *filename = filename_from_str(filename_str);
    int status;
    bool ret;
    char *err;

    ret = true;

    /*
     * Try without a passphrase.
     */
    status = pageant_add_keyfile(filename, NULL, &err, add_encrypted);
    if (status == PAGEANT_ACTION_OK) {
        goto cleanup;
    } else if (status == PAGEANT_ACTION_FAILURE) {
        fprintf(stderr, "pageant: %s: %s\n", filename_str, err);
        ret = false;
        goto cleanup;
    }

    /*
     * And now try prompting for a passphrase.
     */
    while (1) {
        char *prompt = dupprintf(
            "Enter passphrase to load key '%s'", err);
        char *passphrase = askpass(prompt);
        sfree(err);
        sfree(prompt);
        err = NULL;
        if (!passphrase)
            break;

        status = pageant_add_keyfile(filename, passphrase, &err,
                                     add_encrypted);

        smemclr(passphrase, strlen(passphrase));
        sfree(passphrase);
        passphrase = NULL;

        if (status == PAGEANT_ACTION_OK) {
            goto cleanup;
        } else if (status == PAGEANT_ACTION_FAILURE) {
            fprintf(stderr, "pageant: %s: %s\n", filename_str, err);
            ret = false;
            goto cleanup;
        }
    }

  cleanup:
    sfree(err);
    filename_free(filename);
    return ret;
}